

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyDesc(JSContext *ctx,JSValue obj,JSAtom prop,JSValue desc,int flags)

{
  JSValue getter;
  JSValue setter;
  int iVar1;
  JSPropertyDescriptor d;
  
  iVar1 = js_obj_to_desc(ctx,&d,desc);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    getter.tag = d.getter.tag;
    getter.u.float64 = d.getter.u.float64;
    setter.tag = d.setter.tag;
    setter.u.float64 = d.setter.u.float64;
    iVar1 = JS_DefineProperty(ctx,obj,prop,d.value,getter,setter,flags | d.flags);
    js_free_desc(ctx,&d);
  }
  return iVar1;
}

Assistant:

static __exception int JS_DefinePropertyDesc(JSContext *ctx, JSValueConst obj,
                                             JSAtom prop, JSValueConst desc,
                                             int flags)
{
    JSPropertyDescriptor d;
    int ret;

    if (js_obj_to_desc(ctx, &d, desc) < 0)
        return -1;

    ret = JS_DefineProperty(ctx, obj, prop,
                            d.value, d.getter, d.setter, d.flags | flags);
    js_free_desc(ctx, &d);
    return ret;
}